

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,status_type *S)

{
  undefined4 uVar1;
  uint uVar2;
  ostream *poVar3;
  uint i;
  ulong uVar4;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  poVar3 = std::operator<<(out,'(');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  uVar4 = 0;
  while( true ) {
    uVar2 = lagfib2plus<unsigned_int,_168U,_521U>::status_type::size();
    if (uVar2 <= uVar4) break;
    poVar3 = std::operator<<(out,' ');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    uVar4 = uVar4 + 1;
  }
  std::operator<<(out,')');
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.index;
        for (unsigned int i{0}; i < S.size(); ++i)
          out << ' ' << S.r[i];
        out << ')';
        out.flags(flags);
        return out;
      }